

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.h
# Opt level: O0

void __thiscall vpl::Scope::CallFunction(Scope *this,string *name)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  reference this_00;
  size_type sVar5;
  reference pvVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  ulong local_38;
  size_t i_1;
  size_t i;
  int frame_size;
  Function *func;
  string *name_local;
  Scope *this_local;
  
  poVar3 = std::operator<<(this->out_,'#');
  poVar3 = std::operator<<(poVar3,"void vpl::Scope::CallFunction(const std::string &)");
  std::operator<<(poVar3,'\n');
  pmVar4 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->func_name_map_,name);
  this_00 = std::vector<vpl::Function,_std::allocator<vpl::Function>_>::operator[]
                      (&this->functions_,(long)*pmVar4);
  i._4_4_ = 0;
  i_1 = 0;
  while( true ) {
    sVar5 = std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>::size(&this->scopes_);
    if (sVar5 <= i_1) break;
    pvVar6 = std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>::operator[]
                       (&this->scopes_,i_1);
    bVar1 = NameScope::IsGlobal(pvVar6);
    if (!bVar1) {
      pvVar6 = std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>::operator[]
                         (&this->scopes_,i_1);
      iVar2 = NameScope::Size(pvVar6);
      i._4_4_ = iVar2 + i._4_4_;
    }
    i_1 = i_1 + 1;
  }
  poVar3 = std::operator<<(this->out_,"    push ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,i._4_4_);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(this->out_,"    push %");
  iVar2 = StackPointerRegister(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,'\n');
  std::operator<<(this->out_,"    add\n");
  poVar3 = std::operator<<(this->out_,"    pop %");
  iVar2 = StackPointerRegister(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,'\n');
  local_38 = 0;
  while( true ) {
    pvVar7 = Function::GetArgs_abi_cxx11_(this_00);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar7);
    if (sVar5 <= local_38) break;
    poVar3 = std::operator<<(this->out_,"    pop !");
    iVar2 = StackPointerRegister(this);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<(this->out_,"    push %");
    iVar2 = StackPointerRegister(this);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,'\n');
    std::operator<<(this->out_,"    push 1\n");
    std::operator<<(this->out_,"    add\n");
    poVar3 = std::operator<<(this->out_,"    pop %");
    iVar2 = StackPointerRegister(this);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,'\n');
    Pop(this);
    local_38 = local_38 + 1;
  }
  poVar3 = std::operator<<(this->out_,"    push %");
  iVar2 = StackPointerRegister(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(this->out_,"    push ");
  pvVar7 = Function::GetArgs_abi_cxx11_(this_00);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(pvVar7);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
  std::operator<<(poVar3,"\n");
  std::operator<<(this->out_,"    sub\n");
  poVar3 = std::operator<<(this->out_,"    pop %");
  iVar2 = StackPointerRegister(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(this->out_,"    call ");
  poVar3 = std::operator<<(poVar3,(string *)name);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(this->out_,"    pop %");
  iVar2 = StackPointerRegister(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(this->out_,"    push %");
  iVar2 = RetRegister(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,'\n');
  return;
}

Assistant:

void CallFunction(const std::string& name) {
        LOG
        Function* func = &functions_[func_name_map_[name]];

        int frame_size = 0;
        for (size_t i = 0; i < scopes_.size(); ++i) {
            if (!scopes_[i].IsGlobal()) {
                frame_size += scopes_[i].Size();
            }
        }

        out_ << "    push " << frame_size << '\n';
        out_ << "    push %" << StackPointerRegister() << '\n';
        out_ << "    add\n";
        out_ << "    pop %" << StackPointerRegister() << '\n';

        for (size_t i = 0; i < func->GetArgs().size(); ++i) {
            out_ << "    pop !" << StackPointerRegister() << '\n';
            out_ << "    push %" << StackPointerRegister() << '\n';
            out_ << "    push 1\n";
            out_ << "    add\n";
            out_ << "    pop %" << StackPointerRegister() << '\n';
            Pop();
        }
        out_ << "    push %" << StackPointerRegister() << '\n';
        out_ << "    push " << func->GetArgs().size() << "\n";
        out_ << "    sub\n";
        out_ << "    pop %" << StackPointerRegister() << '\n';

        out_ << "    call " << name << '\n';
        out_ << "    pop %" << StackPointerRegister() << '\n';
        out_ << "    push %" << RetRegister() << '\n';
    }